

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfDynamicInfo.cpp
# Opt level: O0

DynamicList * __thiscall
libelfxx::ElfDynamicInfo::find
          (DynamicList *__return_storage_ptr__,ElfDynamicInfo *this,uint64_t tag)

{
  bool bVar1;
  const_iterator cVar2;
  pointer ppVar3;
  _Self local_40;
  const_iterator itr;
  const_iterator lower_bound;
  const_iterator upper_bound;
  uint64_t tag_local;
  ElfDynamicInfo *this_local;
  DynamicList *rv;
  
  upper_bound._M_node = (_Base_ptr)tag;
  lower_bound = std::
                multimap<unsigned_long,_libelfxx::ElfDynamic_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libelfxx::ElfDynamic_*>_>_>
                ::upper_bound(&this->_dyns,(key_type *)&upper_bound);
  cVar2 = std::
          multimap<unsigned_long,_libelfxx::ElfDynamic_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libelfxx::ElfDynamic_*>_>_>
          ::lower_bound(&this->_dyns,(key_type *)&upper_bound);
  itr._M_node._7_1_ = 0;
  std::vector<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>::vector
            (__return_storage_ptr__);
  local_40._M_node = cVar2._M_node;
  while (bVar1 = std::operator!=(&local_40,&lower_bound), bVar1) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_libelfxx::ElfDynamic_*>_>::
             operator->(&local_40);
    std::vector<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>::push_back
              (__return_storage_ptr__,ppVar3->second);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_libelfxx::ElfDynamic_*>_>::
    operator++(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

ElfDynamicInfo::DynamicList ElfDynamicInfo::find(uint64_t tag) const
{
  auto upper_bound = _dyns.upper_bound(tag);
  auto lower_bound = _dyns.lower_bound(tag);
  DynamicList rv;
  for (auto itr = lower_bound;itr != upper_bound;++itr) {
    rv.push_back(*itr->second);
  }
  return rv;
}